

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

object_type * __thiscall
entt::basic_storage<entt::entity,Swarm,void>::construct<Swarm_const&>
          (basic_storage<entt::entity,Swarm,void> *this,entity_type entt,Swarm *args)

{
  reference pvVar1;
  Swarm local_24;
  Swarm *local_20;
  Swarm *args_local;
  basic_storage<entt::entity,Swarm,void> *pbStack_10;
  entity_type entt_local;
  basic_storage<entt::entity,_Swarm,_void> *this_local;
  
  local_24 = (Swarm)args->value;
  local_20 = args;
  args_local._4_4_ = entt;
  pbStack_10 = this;
  std::vector<Swarm,_std::allocator<Swarm>_>::emplace_back<Swarm>
            ((vector<Swarm,_std::allocator<Swarm>_> *)(this + 0x38),&local_24);
  sparse_set<entt::entity>::construct((sparse_set<entt::entity> *)this,args_local._4_4_);
  pvVar1 = std::vector<Swarm,_std::allocator<Swarm>_>::back
                     ((vector<Swarm,_std::allocator<Swarm>_> *)(this + 0x38));
  return pvVar1;
}

Assistant:

object_type & construct(const entity_type entt, Args &&... args) {
        if constexpr(std::is_aggregate_v<object_type>) {
            instances.emplace_back(Type{std::forward<Args>(args)...});
        } else {
            instances.emplace_back(std::forward<Args>(args)...);
        }

        // entity goes after component in case constructor throws
        underlying_type::construct(entt);
        return instances.back();
    }